

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_posix.h
# Opt level: O3

int loadScript(char *filePath,long uline,void *thunk,
              _func_int_char_ptr_long_int_ptr_void_ptr *evalFunc)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  char *__s;
  ushort **ppuVar7;
  int level;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  stat buf;
  size_t local_f8;
  long local_e8;
  stat local_c0;
  
  iVar3 = stat(filePath,&local_c0);
  if (((iVar3 != 0) || (iVar3 = 0, (local_c0.st_mode & 0xf000) != 0x4000)) &&
     (__stream = fopen(filePath,"r"), iVar3 = 0, __stream != (FILE *)0x0)) {
    local_f8 = 0x1000;
    __s = (char *)malloc(0x1000);
    iVar3 = 1;
    local_e8 = uline;
LAB_001033c4:
    iVar4 = feof(__stream);
    lVar2 = local_e8;
    while (iVar4 == 0) {
      memset(__s,0,local_f8);
      uVar10 = 0;
      local_e8 = lVar2;
      bVar1 = false;
      iVar4 = 0;
LAB_00103404:
      do {
        iVar5 = fgetc(__stream);
      } while (iVar5 == 0xd);
      uVar9 = uVar10;
      if (iVar5 != -1) {
        if (iVar5 == 10) {
          if (local_f8 <= uVar10) {
            local_f8 = local_f8 * 2;
            __s = (char *)realloc(__s,local_f8);
          }
          local_e8 = local_e8 + 1;
          __s[uVar10] = '\n';
          uVar9 = uVar10 + 1;
          if (!bVar1 && iVar4 == 10) goto LAB_001035df;
LAB_001035b1:
          uVar10 = uVar10 + 1;
          if (iVar4 == 0x7b) {
            bVar1 = true;
          }
          bVar11 = bVar1;
          if (iVar4 == 10) {
            bVar11 = false;
          }
          iVar4 = iVar5;
          if (iVar5 == 0x7d) {
            bVar1 = bVar11;
          }
        }
        else {
          if (local_f8 <= uVar10) {
            local_f8 = local_f8 * 2;
            __s = (char *)realloc(__s,local_f8);
          }
          __s[uVar10] = (char)iVar5;
          uVar9 = uVar10 + 1;
          if (iVar5 == 0x2a && iVar4 == 0x2f) {
            iVar8 = 1;
            uVar10 = uVar9;
            iVar5 = 0;
            do {
              do {
                iVar6 = fgetc(__stream);
              } while (iVar6 == 0xd);
              if (iVar6 == -1) {
                iVar4 = 0x2f;
                break;
              }
              if (iVar6 == 10) {
                local_e8 = local_e8 + 1;
              }
              if (local_f8 <= uVar10) {
                local_f8 = local_f8 * 2;
                __s = (char *)realloc(__s,local_f8);
              }
              __s[uVar10] = (char)iVar6;
              uVar10 = uVar10 + 1;
              iVar4 = 0x2f;
              iVar8 = (iVar8 - (uint)(iVar6 == 0x2f && iVar5 == 0x2a)) +
                      (uint)(iVar6 == 0x2a && iVar5 == 0x2f);
              iVar5 = iVar6;
            } while (iVar8 != 0);
          }
          else {
            if ((0x3e < iVar5 - 0x22U) ||
               (iVar8 = iVar5, (0x4000000000000021U >> ((ulong)(iVar5 - 0x22U) & 0x3f) & 1) == 0))
            goto LAB_001035b1;
            do {
              do {
                iVar6 = fgetc(__stream);
              } while (iVar6 == 0xd);
              uVar10 = uVar9;
              if (iVar6 == -1) break;
              if (iVar6 == 10) {
                local_e8 = local_e8 + 1;
              }
              if (local_f8 <= uVar9) {
                local_f8 = local_f8 * 2;
                __s = (char *)realloc(__s,local_f8);
              }
              __s[uVar9] = (char)iVar6;
              uVar9 = uVar9 + 1;
              bVar11 = iVar8 == 0x5c;
              uVar10 = uVar9;
              iVar8 = iVar6;
            } while (bVar11 || iVar6 != iVar5);
          }
        }
        goto LAB_00103404;
      }
LAB_001035df:
      if (((int)lVar2 == 1) && (2 < uVar9)) {
        if ((*__s != '#') || (__s[1] != '!')) {
LAB_00103602:
          ppuVar7 = __ctype_b_loc();
          uVar10 = 0;
          do {
            if ((*(byte *)((long)*ppuVar7 + (long)__s[uVar10] * 2 + 1) & 0x20) == 0) {
              local_c0.st_dev._0_4_ = 0;
              iVar3 = (*evalFunc)(__s,lVar2,(int *)&local_c0,thunk);
              if ((iVar3 == 0) || ((int)local_c0.st_dev != 0)) goto LAB_00103665;
              goto LAB_001033c4;
            }
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
      }
      else if (uVar9 != 0) goto LAB_00103602;
      iVar4 = feof(__stream);
      lVar2 = local_e8;
    }
LAB_00103665:
    free(__s);
    fclose(__stream);
  }
  return iVar3;
}

Assistant:

static int loadScript(const char *filePath, long uline, void *thunk, int (*evalFunc)(const char*, long, int *, void *))
{
	int isSuccessfullyLoading = false;
	if(isDir(filePath)) {
		return isSuccessfullyLoading;
	}
	FILE *fp = fopen(filePath, "r");
	if(fp != NULL) {
		SimpleBuffer simpleBuffer;
		simpleBuffer.buffer = (char *)malloc(K_PAGESIZE);
		simpleBuffer.allocSize = K_PAGESIZE;
		isSuccessfullyLoading = true;
		while(!feof(fp)) {
			kfileline_t rangeheadline = uline;
			khalfword_t sline = (khalfword_t)uline;
			bzero(simpleBuffer.buffer, simpleBuffer.allocSize);
			simpleBuffer.size = 0;
			uline = readChunk(fp, uline, &simpleBuffer);
			const char *script = (const char *)simpleBuffer.buffer;
			if(sline == 1 && simpleBuffer.size > 2 && script[0] == '#' && script[1] == '!') {
				// fall through this line
				simpleBuffer.size = 0;
				//TODO: do we increment uline??
			}
			if(!isEmptyChunk(script, simpleBuffer.size)) {
				int isBreak = false;
				isSuccessfullyLoading = evalFunc(script, rangeheadline, &isBreak, thunk);
				if(!isSuccessfullyLoading|| isBreak) {
					break;
				}
			}
		}
		free(simpleBuffer.buffer);
		fclose(fp);
	}
	return isSuccessfullyLoading;
}